

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cpp
# Opt level: O2

LPWSTR GetCommandLineW(void)

{
  char16_t *pcVar1;
  
  if (PAL_InitializeChakraCoreCalled) {
    pcVar1 = L"";
    if (g_lpwstrCmdLine != (LPWSTR)0x0) {
      pcVar1 = g_lpwstrCmdLine;
    }
    return pcVar1;
  }
  abort();
}

Assistant:

LPWSTR
PALAPI
GetCommandLineW(
    VOID)
{
    PERF_ENTRY(GetCommandLineW);
    ENTRY("GetCommandLineW()\n");

    LPWSTR lpwstr = g_lpwstrCmdLine ? g_lpwstrCmdLine : (LPWSTR)W("");

    LOGEXIT("GetCommandLineW returns LPWSTR %p (%S)\n",
          g_lpwstrCmdLine,
          lpwstr);
    PERF_EXIT(GetCommandLineW);

    return lpwstr;
}